

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void incomplete_block_test(void)

{
  double dVar1;
  fdb_kvs_handle *doc;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  fdb_kvs_handle *config;
  size_t bodylen;
  long in_RCX;
  ulong uVar5;
  long lVar6;
  fdb_kvs_handle **ptr_handle;
  uint8_t *unaff_RBP;
  char *pcVar7;
  code *__src;
  void *unaff_R12;
  long unaff_R13;
  fdb_doc **doc_00;
  btree *doc_01;
  double dVar8;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *pfStack_860;
  fdb_kvs_handle *pfStack_858;
  double dStack_850;
  fdb_kvs_handle *pfStack_848;
  fdb_file_handle *pfStack_840;
  timeval tStack_838;
  fdb_kvs_config fStack_828;
  fdb_doc *apfStack_810 [10];
  double adStack_7c0 [33];
  fdb_config fStack_6b8;
  char acStack_5c0 [264];
  fdb_kvs_handle **ppfStack_4b8;
  void *pvStack_4b0;
  long lStack_4a8;
  fdb_kvs_handle *pfStack_4a0;
  btree *pbStack_498;
  uint8_t *puStack_490;
  fdb_kvs_handle *local_478;
  fdb_kvs_handle *local_470;
  undefined1 auStack_468 [24];
  timeval local_450;
  fdb_kvs_handle local_440;
  char local_228 [256];
  fdb_config local_128;
  
  puStack_490 = (uint8_t *)0x1146e8;
  gettimeofday(&local_450,(__timezone_ptr_t)0x0);
  puStack_490 = (uint8_t *)0x1146ed;
  memleak_start();
  local_478 = (fdb_kvs_handle *)0x0;
  puStack_490 = (uint8_t *)0x1146fe;
  system("rm -rf  dummy* > errorlog.txt");
  puStack_490 = (uint8_t *)0x11470e;
  fdb_get_default_config();
  config = &local_440;
  puStack_490 = (uint8_t *)0x11471b;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  doc_01 = (btree *)(auStack_468 + 0x10);
  puStack_490 = (uint8_t *)0x114749;
  fdb_open((fdb_file_handle **)doc_01,"./dummy1",&local_128);
  ptr_handle = &local_470;
  puStack_490 = (uint8_t *)0x11475c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_468._16_8_,ptr_handle,&config->kvs_config);
  puStack_490 = (uint8_t *)0x114772;
  fVar2 = fdb_set_log_callback(local_470,logCallbackFunc,"incomplete_block_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (void *)0x0;
    uVar5 = 0;
    do {
      puStack_490 = (uint8_t *)0x11479a;
      sprintf(local_228,"key%d",uVar5 & 0xffffffff);
      puStack_490 = (uint8_t *)0x1147b2;
      sprintf((char *)(local_440.config.encryption_key.bytes + 0x14),"meta%d",uVar5 & 0xffffffff);
      puStack_490 = (uint8_t *)0x1147c7;
      sprintf((char *)&local_440.kvs,"body%d",uVar5 & 0xffffffff);
      doc_01 = (btree *)(auStack_468 + (long)unaff_R12);
      puStack_490 = (uint8_t *)0x1147d7;
      sVar4 = strlen(local_228);
      unaff_RBP = local_440.config.encryption_key.bytes + 0x14;
      puStack_490 = (uint8_t *)0x1147ea;
      config = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      puStack_490 = (uint8_t *)0x1147f7;
      bodylen = strlen((char *)&local_440.kvs);
      puStack_490 = (uint8_t *)0x114819;
      fdb_doc_create((fdb_doc **)doc_01,local_228,sVar4,unaff_RBP,(size_t)config,&local_440.kvs,
                     bodylen);
      puStack_490 = (uint8_t *)0x114828;
      fdb_set(local_470,*(fdb_doc **)(auStack_468 + uVar5 * 8));
      uVar5 = uVar5 + 1;
      unaff_R12 = (void *)((long)unaff_R12 + 8);
    } while (uVar5 == 1);
    unaff_R13 = 0;
    ptr_handle = &local_478;
    while( true ) {
      in_RCX = 0;
      puStack_490 = (uint8_t *)0x114865;
      fdb_doc_create((fdb_doc **)ptr_handle,(void *)(*(size_t **)(auStack_468 + unaff_R13 * 8))[4],
                     **(size_t **)(auStack_468 + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0);
      puStack_490 = (uint8_t *)0x114874;
      fVar2 = fdb_get(local_470,(fdb_doc *)local_478);
      doc = local_478;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      doc_01 = local_478->staletree;
      unaff_RBP = *(uint8_t **)(auStack_468 + unaff_R13 * 8);
      unaff_R12 = *(void **)(unaff_RBP + 0x38);
      puStack_490 = (uint8_t *)0x11489d;
      iVar3 = bcmp(doc_01,unaff_R12,(size_t)(local_478->kvs_config).custom_cmp);
      config = doc;
      if (iVar3 != 0) goto LAB_0011495d;
      doc_01 = (doc->field_6).seqtree;
      unaff_R12 = *(void **)(unaff_RBP + 0x40);
      puStack_490 = (uint8_t *)0x1148bc;
      iVar3 = bcmp(doc_01,unaff_R12,(size_t)(doc->kvs_config).custom_cmp_param);
      if (iVar3 != 0) goto LAB_00114968;
      puStack_490 = (uint8_t *)0x1148cc;
      fdb_doc_free((fdb_doc *)doc);
      local_478 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      if (unaff_R13 != 1) {
        puStack_490 = (uint8_t *)0x1148ec;
        fdb_kvs_close(local_470);
        puStack_490 = (uint8_t *)0x1148f6;
        fdb_close((fdb_file_handle *)auStack_468._16_8_);
        lVar6 = 0;
        do {
          puStack_490 = (uint8_t *)0x114902;
          fdb_doc_free(*(fdb_doc **)(auStack_468 + lVar6 * 8));
          lVar6 = lVar6 + 1;
        } while (lVar6 == 1);
        puStack_490 = (uint8_t *)0x114910;
        fdb_shutdown();
        puStack_490 = (uint8_t *)0x114915;
        memleak_end();
        pcVar7 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar7 = "%s FAILED\n";
        }
        puStack_490 = (uint8_t *)0x114946;
        fprintf(_stderr,pcVar7,"incomplete block test");
        return;
      }
    }
    puStack_490 = (uint8_t *)0x11495d;
    incomplete_block_test();
LAB_0011495d:
    puStack_490 = (uint8_t *)0x114968;
    incomplete_block_test();
LAB_00114968:
    puStack_490 = (uint8_t *)0x114973;
    incomplete_block_test();
  }
  puStack_490 = (uint8_t *)custom_compare_primitive_test;
  incomplete_block_test();
  uVar5 = 0;
  ppfStack_4b8 = ptr_handle;
  pvStack_4b0 = unaff_R12;
  lStack_4a8 = unaff_R13;
  pfStack_4a0 = config;
  pbStack_498 = doc_01;
  puStack_490 = unaff_RBP;
  gettimeofday(&tStack_838,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_860 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_6b8.buffercache_size = 0;
  fStack_6b8.wal_threshold = 0x400;
  fStack_6b8.flags = 1;
  fStack_6b8.compaction_threshold = '\0';
  fStack_6b8.multi_kv_instances = true;
  fStack_828.custom_cmp = _cmp_double;
  fdb_open(&pfStack_840,"./dummy1",&fStack_6b8);
  fdb_kvs_open_default(pfStack_840,&pfStack_848,&fStack_828);
  __src = logCallbackFunc;
  fVar2 = fdb_set_log_callback(pfStack_848,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00114d94;
  doc_00 = apfStack_810;
  lVar6 = 0;
  do {
    dVar8 = 10000.0 / (double)(int)lVar6;
    adStack_7c0[0] = dVar8;
    sprintf(acStack_5c0,"value: %d, %f",dVar8,uVar5);
    sVar4 = strlen(acStack_5c0);
    fdb_doc_create(doc_00,adStack_7c0,8,(void *)0x0,0,acStack_5c0,sVar4 + 1);
    fdb_set(pfStack_848,*doc_00);
    lVar6 = lVar6 + 0xb;
    uVar5 = (ulong)((int)uVar5 + 1);
    doc_00 = doc_00 + 1;
  } while (lVar6 != 0x6e);
  in_RCX = 0;
  dStack_850 = dVar8;
  fdb_iterator_init(pfStack_848,(fdb_iterator **)&pfStack_858,(void *)0x0,0,(void *)0x0,0,0);
  dVar8 = -1.0;
  do {
    __src = (code *)&pfStack_860;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_858,&pfStack_860);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00114d7b:
      custom_compare_primitive_test();
      goto LAB_00114d80;
    }
    __src = (code *)pfStack_860->key;
    memcpy(&dStack_850,__src,pfStack_860->keylen);
    dVar1 = dStack_850;
    if (dStack_850 <= dVar8) {
      custom_compare_primitive_test();
      goto LAB_00114d7b;
    }
    fdb_doc_free(pfStack_860);
    pfStack_860 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_858);
    dVar8 = dVar1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)pfStack_858);
  fdb_commit(pfStack_840,'\x01');
  in_RCX = 0;
  fdb_iterator_init(pfStack_848,(fdb_iterator **)&pfStack_858,(void *)0x0,0,(void *)0x0,0,0);
  dVar8 = -1.0;
  do {
    __src = (code *)&pfStack_860;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_858,&pfStack_860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00114d85;
    __src = (code *)pfStack_860->key;
    memcpy(&dStack_850,__src,pfStack_860->keylen);
    dVar1 = dStack_850;
    if (dStack_850 <= dVar8) goto LAB_00114d80;
    fdb_doc_free(pfStack_860);
    pfStack_860 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_858);
    dVar8 = dVar1;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)pfStack_858);
  fdb_compact(pfStack_840,"./dummy2");
  in_RCX = 0;
  fdb_iterator_init(pfStack_848,(fdb_iterator **)&pfStack_858,(void *)0x0,0,(void *)0x0,0,0);
  dVar8 = -1.0;
  while (__src = (code *)&pfStack_860,
        fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_858,&pfStack_860),
        fVar2 == FDB_RESULT_SUCCESS) {
    __src = (code *)pfStack_860->key;
    memcpy(&dStack_850,__src,pfStack_860->keylen);
    dVar1 = dStack_850;
    if (dStack_850 <= dVar8) goto LAB_00114d8a;
    fdb_doc_free(pfStack_860);
    pfStack_860 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_858);
    dVar8 = dVar1;
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close((fdb_iterator *)pfStack_858);
      fdb_kvs_close(pfStack_848);
      fdb_close(pfStack_840);
      lVar6 = 0;
      do {
        fdb_doc_free(apfStack_810[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
      fdb_shutdown();
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (custom_compare_primitive_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"custom compare function for primitive key test");
      return;
    }
  }
  goto LAB_00114d8f;
LAB_00114d80:
  custom_compare_primitive_test();
LAB_00114d85:
  custom_compare_primitive_test();
LAB_00114d8a:
  custom_compare_primitive_test();
LAB_00114d8f:
  custom_compare_primitive_test();
LAB_00114d94:
  custom_compare_primitive_test();
  if (((fdb_doc **)__src != (fdb_doc **)0x0) && (in_RCX == 0)) {
    return;
  }
  return;
}

Assistant:

void incomplete_block_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 2;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "incomplete_block_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        // updated documents
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("incomplete block test");
}